

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::Module::updateFunctionsMap(Module *this)

{
  bool bVar1;
  reference this_00;
  pointer pFVar2;
  pointer __k;
  mapped_type *ppFVar3;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *curr;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range1;
  Module *this_local;
  
  std::
  unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  ::clear(&this->functionsMap);
  __end1 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin(&this->functions);
  curr = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end(&this->functions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                *)&curr);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
              ::operator*(&__end1);
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(this_00);
    __k = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->(this_00)
    ;
    ppFVar3 = std::
              unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
              ::operator[](&this->functionsMap,(key_type *)__k);
    *ppFVar3 = pFVar2;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Module::updateFunctionsMap() {
  functionsMap.clear();
  for (auto& curr : functions) {
    functionsMap[curr->name] = curr.get();
  }
}